

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL12Key Keysym20to12(SDL_Keycode keysym20)

{
  SDL12Key local_c;
  SDL_Keycode keysym20_local;
  
  if (keysym20 < 0x100) {
    if (keysym20 == 0x40000048) {
      local_c = SDLK12_PAUSE;
    }
    else {
      local_c = keysym20;
      if (keysym20 == 0x4000009c) {
        local_c = SDLK12_CLEAR;
      }
    }
  }
  else if (keysym20 == 0x2e) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x100) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0x101) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x102) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x103) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x104) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x105) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x106) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x107) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x108) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x109) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x10a) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x10b) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x10c) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x10d) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x10e) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x10f) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x110) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x111) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x112) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x113) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0x116) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x117) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x118) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x119) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x11a) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x11b) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x11c) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x11d) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x11e) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x11f) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x120) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x121) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x122) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x123) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x124) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x125) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x126) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x127) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x128) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x129) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x12a) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 299) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x12e) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0x12f) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x130) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x131) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0x134) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x135) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x136) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0x137) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0x138) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x139) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x13a) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x13b) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x13c) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x13d) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x13e) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x141) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x142) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x143) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x144) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x145) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x146) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x147) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x148) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x14a) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x14b) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x14c) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x14d) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x150) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x151) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x154) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0x155) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x156) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x157) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x158) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x159) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x15a) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x15b) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x15c) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x15d) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x15e) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x15f) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0x160) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x161) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0x162) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x163) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x164) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x165) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x166) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x167) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x168) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x169) {
    local_c = SDLK12_WORLD_93;
  }
  else if (keysym20 == 0x16a) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x16b) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x16c) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x16d) {
    local_c = SDLK12_WORLD_93;
  }
  else if (keysym20 == 0x16e) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x16f) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x170) {
    local_c = SDLK12_WORLD_59;
  }
  else if (keysym20 == 0x171) {
    local_c = SDLK12_WORLD_91;
  }
  else if (keysym20 == 0x172) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x173) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x179) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x17a) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x17b) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x17c) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x17d) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x17e) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0x192) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0x2c7) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0x2d8) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x2d9) {
    local_c = SDLK12_WORLD_95;
  }
  else if (keysym20 == 0x2db) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0x2dd) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x385) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x386) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x388) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x389) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x38a) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0x38c) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0x38e) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0x38f) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x390) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x391) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0x392) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0x393) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x394) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0x395) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x396) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x397) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0x398) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x399) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x39a) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x39b) {
    local_c = SDLK12_WORLD_43;
  }
  else if (keysym20 == 0x39c) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x39d) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x39e) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x39f) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x3a0) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x3a1) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x3a3) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x3a4) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0x3a5) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x3a6) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x3a7) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0x3a8) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x3a9) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x3aa) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x3ab) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x3ac) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x3ad) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0x3ae) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x3af) {
    local_c = SDLK12_WORLD_20;
  }
  else if (keysym20 == 0x3b0) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0x3b1) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0x3b2) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0x3b3) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x3b4) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0x3b5) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x3b6) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x3b7) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x3b8) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x3b9) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0x3ba) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x3bb) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0x3bc) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x3bd) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0x3be) {
    local_c = SDLK12_WORLD_78;
  }
  else if (keysym20 == 0x3bf) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x3c0) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x3c1) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x3c2) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0x3c3) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x3c4) {
    local_c = SDLK12_WORLD_84;
  }
  else if (keysym20 == 0x3c5) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x3c6) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0x3c7) {
    local_c = SDLK12_WORLD_87;
  }
  else if (keysym20 == 0x3c8) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x3c9) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x3ca) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x3cb) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0x3cc) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0x3cd) {
    local_c = SDLK12_WORLD_24;
  }
  else if (keysym20 == 0x3ce) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x401) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x402) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x403) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0x404) {
    local_c = SDLK12_WORLD_20;
  }
  else if (keysym20 == 0x405) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x406) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x407) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0x408) {
    local_c = SDLK12_WORLD_24;
  }
  else if (keysym20 == 0x409) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0x40a) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0x40b) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x40c) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x40e) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0x40f) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x410) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0x411) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0x412) {
    local_c = SDLK12_WORLD_87;
  }
  else if (keysym20 == 0x413) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x414) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0x415) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x416) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0x417) {
    local_c = SDLK12_WORLD_90;
  }
  else if (keysym20 == 0x418) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0x419) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x41a) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0x41b) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x41c) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0x41d) {
    local_c = SDLK12_WORLD_78;
  }
  else if (keysym20 == 0x41e) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x41f) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x420) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x421) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0x422) {
    local_c = SDLK12_WORLD_84;
  }
  else if (keysym20 == 0x423) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x424) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x425) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x426) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x427) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x428) {
    local_c = SDLK12_WORLD_91;
  }
  else if (keysym20 == 0x429) {
    local_c = SDLK12_WORLD_93;
  }
  else if (keysym20 == 0x42a) {
    local_c = SDLK12_WORLD_95;
  }
  else if (keysym20 == 0x42b) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x42c) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x42d) {
    local_c = SDLK12_WORLD_92;
  }
  else if (keysym20 == 0x42e) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x42f) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x430) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0x431) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0x432) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0x433) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0x434) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0x435) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x436) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x437) {
    local_c = SDLK12_WORLD_58;
  }
  else if (keysym20 == 0x438) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x439) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x43a) {
    local_c = SDLK12_WORLD_43;
  }
  else if (keysym20 == 0x43b) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x43c) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x43d) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x43e) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x43f) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x440) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x441) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0x442) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0x443) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x444) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x445) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x446) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x447) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x448) {
    local_c = SDLK12_WORLD_59;
  }
  else if (keysym20 == 0x449) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x44a) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 1099) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x44c) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x44d) {
    local_c = SDLK12_WORLD_60;
  }
  else if (keysym20 == 0x44e) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0x44f) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x451) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x452) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x453) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x454) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0x455) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x456) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x457) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0x458) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0x459) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x45a) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x45b) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x45c) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x45e) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x45f) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x490) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x491) {
    local_c = SDLK12_WORLD_13;
  }
  else if (keysym20 == 0x5d0) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x5d1) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0x5d2) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0x5d3) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x5d4) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0x5d5) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x5d6) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x5d7) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x5d8) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x5d9) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0x5da) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x5db) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0x5dc) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x5dd) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0x5de) {
    local_c = SDLK12_WORLD_78;
  }
  else if (keysym20 == 0x5df) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x5e0) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x5e1) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x5e2) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x5e3) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0x5e4) {
    local_c = SDLK12_WORLD_84;
  }
  else if (keysym20 == 0x5e5) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x5e6) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0x5e7) {
    local_c = SDLK12_WORLD_87;
  }
  else if (keysym20 == 0x5e8) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x5e9) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x5ea) {
    local_c = SDLK12_WORLD_90;
  }
  else if (keysym20 == 0x60c) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x61b) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x61f) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x621) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0x622) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0x623) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x624) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0x625) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x626) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x627) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0x628) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x629) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x62a) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x62b) {
    local_c = SDLK12_WORLD_43;
  }
  else if (keysym20 == 0x62c) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x62d) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x62e) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x62f) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x630) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x631) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x632) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x633) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0x634) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0x635) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x636) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x637) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0x638) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x639) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x63a) {
    local_c = SDLK12_WORLD_58;
  }
  else if (keysym20 == 0x640) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x641) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0x642) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0x643) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x644) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0x645) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x646) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x647) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x648) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x649) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0x64a) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x64b) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0x64c) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x64d) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0x64e) {
    local_c = SDLK12_WORLD_78;
  }
  else if (keysym20 == 0x64f) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x650) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x651) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x652) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0xe01) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0xe02) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0xe03) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0xe04) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0xe05) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0xe06) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0xe07) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0xe08) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0xe09) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0xe0a) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0xe0b) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0xe0c) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0xe0d) {
    local_c = SDLK12_WORLD_13;
  }
  else if (keysym20 == 0xe0e) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0xe0f) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0xe10) {
    local_c = SDLK12_WORLD_16;
  }
  else if (keysym20 == 0xe11) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0xe12) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0xe13) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0xe14) {
    local_c = SDLK12_WORLD_20;
  }
  else if (keysym20 == 0xe15) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0xe16) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0xe17) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0xe18) {
    local_c = SDLK12_WORLD_24;
  }
  else if (keysym20 == 0xe19) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0xe1a) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0xe1b) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0xe1c) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0xe1d) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0xe1e) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0xe1f) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0xe20) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0xe21) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0xe22) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0xe23) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0xe24) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0xe25) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0xe26) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0xe27) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0xe28) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0xe29) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0xe2a) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0xe2b) {
    local_c = SDLK12_WORLD_43;
  }
  else if (keysym20 == 0xe2c) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0xe2d) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0xe2e) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0xe2f) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0xe30) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0xe31) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0xe32) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0xe33) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0xe34) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0xe35) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0xe36) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0xe37) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0xe38) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0xe39) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0xe3a) {
    local_c = SDLK12_WORLD_58;
  }
  else if (keysym20 == 0xe3f) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 0xe40) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0xe41) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0xe42) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0xe43) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0xe44) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0xe45) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0xe46) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0xe47) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0xe48) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0xe49) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0xe4a) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0xe4b) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0xe4c) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0xe4d) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0xe50) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0xe51) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0xe52) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0xe53) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0xe54) {
    local_c = SDLK12_WORLD_84;
  }
  else if (keysym20 == 0xe55) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0xe56) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0xe57) {
    local_c = SDLK12_WORLD_87;
  }
  else if (keysym20 == 0xe58) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0xe59) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x2002) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x2003) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x2004) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x2005) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0x2007) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x2008) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x2009) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0x200a) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0x2012) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x2013) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x2014) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x2015) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x2017) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 0x2018) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x2019) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x201a) {
    local_c = SDLK12_WORLD_93;
  }
  else if (keysym20 == 0x201c) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x201d) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0x201e) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x2020) {
    local_c = SDLK12_WORLD_81;
  }
  else if (keysym20 == 0x2021) {
    local_c = SDLK12_WORLD_82;
  }
  else if (keysym20 == 0x2022) {
    local_c = SDLK12_WORLD_70;
  }
  else if (keysym20 == 0x2025) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x2026) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x2030) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x2032) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x2033) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0x2038) {
    local_c = SDLK12_WORLD_92;
  }
  else if (keysym20 == 0x203e) {
    local_c = 0x7e;
  }
  else if (keysym20 == 0x2105) {
    local_c = SDLK12_WORLD_24;
  }
  else if (keysym20 == 0x2116) {
    local_c = SDLK12_WORLD_16;
  }
  else if (keysym20 == 0x2117) {
    local_c = SDLK12_WORLD_91;
  }
  else if (keysym20 == 0x211e) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0x2122) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x2153) {
    local_c = SDLK12_WORLD_16;
  }
  else if (keysym20 == 0x2154) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x2155) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0x2156) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x2157) {
    local_c = SDLK12_WORLD_20;
  }
  else if (keysym20 == 0x2158) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x2159) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x215a) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0x215b) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x215c) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0x215d) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x215e) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x2190) {
    local_c = SDLK12_WORLD_91;
  }
  else if (keysym20 == 0x2191) {
    local_c = SDLK12_WORLD_92;
  }
  else if (keysym20 == 0x2192) {
    local_c = SDLK12_WORLD_93;
  }
  else if (keysym20 == 0x2193) {
    local_c = SDLK12_WORLD_94;
  }
  else if (keysym20 == 0x21d2) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x21d4) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x2202) {
    local_c = SDLK12_WORLD_79;
  }
  else if (keysym20 == 0x2207) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x221a) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x221d) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0x221e) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0x2227) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x2228) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 0x2229) {
    local_c = SDLK12_WORLD_60;
  }
  else if (keysym20 == 0x222a) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x222b) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x2234) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0x223c) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x2243) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x2260) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x2261) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x2264) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x2265) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0x2282) {
    local_c = SDLK12_WORLD_58;
  }
  else if (keysym20 == 0x2283) {
    local_c = SDLK12_WORLD_59;
  }
  else if (keysym20 == 0x2315) {
    local_c = SDLK12_WORLD_90;
  }
  else if (keysym20 == 0x2320) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0x2321) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x239b) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x239d) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x239e) {
    local_c = SDLK12_WORLD_13;
  }
  else if (keysym20 == 0x23a0) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x23a1) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0x23a3) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0x23a4) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x23a6) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x23a8) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x23ac) {
    local_c = SDLK12_WORLD_16;
  }
  else if (keysym20 == 0x23b7) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x2423) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x2500) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x2502) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x250c) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x25aa) {
    local_c = SDLK12_WORLD_71;
  }
  else if (keysym20 == 0x25ab) {
    local_c = SDLK12_WORLD_65;
  }
  else if (keysym20 == 0x25ac) {
    local_c = SDLK12_WORLD_59;
  }
  else if (keysym20 == 0x25ad) {
    local_c = SDLK12_WORLD_66;
  }
  else if (keysym20 == 0x25ae) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 0x25af) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x25b2) {
    local_c = SDLK12_WORLD_72;
  }
  else if (keysym20 == 0x25b3) {
    local_c = SDLK12_WORLD_67;
  }
  else if (keysym20 == 0x25b6) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x25b7) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x25bc) {
    local_c = SDLK12_WORLD_73;
  }
  else if (keysym20 == 0x25bd) {
    local_c = SDLK12_WORLD_68;
  }
  else if (keysym20 == 0x25c0) {
    local_c = SDLK12_WORLD_60;
  }
  else if (keysym20 == 0x25c1) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x25cb) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x25cf) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x25e6) {
    local_c = SDLK12_WORLD_64;
  }
  else if (keysym20 == 0x2606) {
    local_c = SDLK12_WORLD_69;
  }
  else if (keysym20 == 0x260e) {
    local_c = SDLK12_WORLD_89;
  }
  else if (keysym20 == 0x2613) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x261c) {
    local_c = SDLK12_WORLD_74;
  }
  else if (keysym20 == 0x261e) {
    local_c = SDLK12_WORLD_75;
  }
  else if (keysym20 == 0x2640) {
    local_c = SDLK12_WORLD_88;
  }
  else if (keysym20 == 0x2642) {
    local_c = SDLK12_WORLD_87;
  }
  else if (keysym20 == 0x2663) {
    local_c = SDLK12_WORLD_76;
  }
  else if (keysym20 == 0x2665) {
    local_c = SDLK12_WORLD_78;
  }
  else if (keysym20 == 0x2666) {
    local_c = SDLK12_WORLD_77;
  }
  else if (keysym20 == 0x266d) {
    local_c = SDLK12_WORLD_86;
  }
  else if (keysym20 == 0x266f) {
    local_c = SDLK12_WORLD_85;
  }
  else if (keysym20 == 0x2713) {
    local_c = SDLK12_WORLD_83;
  }
  else if (keysym20 == 0x2717) {
    local_c = SDLK12_WORLD_84;
  }
  else if (keysym20 == 0x271d) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x2720) {
    local_c = SDLK12_WORLD_80;
  }
  else if (keysym20 == 0x27e8) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x27e9) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0x3001) {
    local_c = SDLK12_WORLD_4;
  }
  else if (keysym20 == 0x3002) {
    local_c = SDLK12_WORLD_1;
  }
  else if (keysym20 == 0x300c) {
    local_c = SDLK12_WORLD_2;
  }
  else if (keysym20 == 0x300d) {
    local_c = SDLK12_WORLD_3;
  }
  else if (keysym20 == 0x309b) {
    local_c = SDLK12_WORLD_62;
  }
  else if (keysym20 == 0x309c) {
    local_c = SDLK12_WORLD_63;
  }
  else if (keysym20 == 0x30a1) {
    local_c = SDLK12_WORLD_7;
  }
  else if (keysym20 == 0x30a2) {
    local_c = SDLK12_WORLD_17;
  }
  else if (keysym20 == 0x30a3) {
    local_c = SDLK12_WORLD_8;
  }
  else if (keysym20 == 0x30a4) {
    local_c = SDLK12_WORLD_18;
  }
  else if (keysym20 == 0x30a5) {
    local_c = SDLK12_WORLD_9;
  }
  else if (keysym20 == 0x30a6) {
    local_c = SDLK12_WORLD_19;
  }
  else if (keysym20 == 0x30a7) {
    local_c = SDLK12_WORLD_10;
  }
  else if (keysym20 == 0x30a8) {
    local_c = SDLK12_WORLD_20;
  }
  else if (keysym20 == 0x30a9) {
    local_c = SDLK12_WORLD_11;
  }
  else if (keysym20 == 0x30aa) {
    local_c = SDLK12_WORLD_21;
  }
  else if (keysym20 == 0x30ab) {
    local_c = SDLK12_WORLD_22;
  }
  else if (keysym20 == 0x30ad) {
    local_c = SDLK12_WORLD_23;
  }
  else if (keysym20 == 0x30af) {
    local_c = SDLK12_WORLD_24;
  }
  else if (keysym20 == 0x30b1) {
    local_c = SDLK12_WORLD_25;
  }
  else if (keysym20 == 0x30b3) {
    local_c = SDLK12_WORLD_26;
  }
  else if (keysym20 == 0x30b5) {
    local_c = SDLK12_WORLD_27;
  }
  else if (keysym20 == 0x30b7) {
    local_c = SDLK12_WORLD_28;
  }
  else if (keysym20 == 0x30b9) {
    local_c = SDLK12_WORLD_29;
  }
  else if (keysym20 == 0x30bb) {
    local_c = SDLK12_WORLD_30;
  }
  else if (keysym20 == 0x30bd) {
    local_c = SDLK12_WORLD_31;
  }
  else if (keysym20 == 0x30bf) {
    local_c = SDLK12_WORLD_32;
  }
  else if (keysym20 == 0x30c1) {
    local_c = SDLK12_WORLD_33;
  }
  else if (keysym20 == 0x30c3) {
    local_c = SDLK12_WORLD_15;
  }
  else if (keysym20 == 0x30c4) {
    local_c = SDLK12_WORLD_34;
  }
  else if (keysym20 == 0x30c6) {
    local_c = SDLK12_WORLD_35;
  }
  else if (keysym20 == 0x30c8) {
    local_c = SDLK12_WORLD_36;
  }
  else if (keysym20 == 0x30ca) {
    local_c = SDLK12_WORLD_37;
  }
  else if (keysym20 == 0x30cb) {
    local_c = SDLK12_WORLD_38;
  }
  else if (keysym20 == 0x30cc) {
    local_c = SDLK12_WORLD_39;
  }
  else if (keysym20 == 0x30cd) {
    local_c = SDLK12_WORLD_40;
  }
  else if (keysym20 == 0x30ce) {
    local_c = SDLK12_WORLD_41;
  }
  else if (keysym20 == 0x30cf) {
    local_c = SDLK12_WORLD_42;
  }
  else if (keysym20 == 0x30d2) {
    local_c = SDLK12_WORLD_43;
  }
  else if (keysym20 == 0x30d5) {
    local_c = SDLK12_WORLD_44;
  }
  else if (keysym20 == 0x30d8) {
    local_c = SDLK12_WORLD_45;
  }
  else if (keysym20 == 0x30db) {
    local_c = SDLK12_WORLD_46;
  }
  else if (keysym20 == 0x30de) {
    local_c = SDLK12_WORLD_47;
  }
  else if (keysym20 == 0x30df) {
    local_c = SDLK12_WORLD_48;
  }
  else if (keysym20 == 0x30e0) {
    local_c = SDLK12_WORLD_49;
  }
  else if (keysym20 == 0x30e1) {
    local_c = SDLK12_WORLD_50;
  }
  else if (keysym20 == 0x30e2) {
    local_c = SDLK12_WORLD_51;
  }
  else if (keysym20 == 0x30e3) {
    local_c = SDLK12_WORLD_12;
  }
  else if (keysym20 == 0x30e4) {
    local_c = SDLK12_WORLD_52;
  }
  else if (keysym20 == 0x30e5) {
    local_c = SDLK12_WORLD_13;
  }
  else if (keysym20 == 0x30e6) {
    local_c = SDLK12_WORLD_53;
  }
  else if (keysym20 == 0x30e7) {
    local_c = SDLK12_WORLD_14;
  }
  else if (keysym20 == 0x30e8) {
    local_c = SDLK12_WORLD_54;
  }
  else if (keysym20 == 0x30e9) {
    local_c = SDLK12_WORLD_55;
  }
  else if (keysym20 == 0x30ea) {
    local_c = SDLK12_WORLD_56;
  }
  else if (keysym20 == 0x30eb) {
    local_c = SDLK12_WORLD_57;
  }
  else if (keysym20 == 0x30ec) {
    local_c = SDLK12_WORLD_58;
  }
  else if (keysym20 == 0x30ed) {
    local_c = SDLK12_WORLD_59;
  }
  else if (keysym20 == 0x30ef) {
    local_c = SDLK12_WORLD_60;
  }
  else if (keysym20 == 0x30f2) {
    local_c = SDLK12_WORLD_6;
  }
  else if (keysym20 == 0x30f3) {
    local_c = SDLK12_WORLD_61;
  }
  else if (keysym20 == 0x30fb) {
    local_c = SDLK12_WORLD_5;
  }
  else if (keysym20 == 0x30fc) {
    local_c = SDLK12_WORLD_16;
  }
  else if (keysym20 == 0x40000039) {
    local_c = SDLK12_CAPSLOCK;
  }
  else if (keysym20 == 0x4000003a) {
    local_c = SDLK12_F1;
  }
  else if (keysym20 == 0x4000003b) {
    local_c = SDLK12_F2;
  }
  else if (keysym20 == 0x4000003c) {
    local_c = SDLK12_F3;
  }
  else if (keysym20 == 0x4000003d) {
    local_c = SDLK12_F4;
  }
  else if (keysym20 == 0x4000003e) {
    local_c = SDLK12_F5;
  }
  else if (keysym20 == 0x4000003f) {
    local_c = SDLK12_F6;
  }
  else if (keysym20 == 0x40000040) {
    local_c = SDLK12_F7;
  }
  else if (keysym20 == 0x40000041) {
    local_c = SDLK12_F8;
  }
  else if (keysym20 == 0x40000042) {
    local_c = SDLK12_F9;
  }
  else if (keysym20 == 0x40000043) {
    local_c = SDLK12_F10;
  }
  else if (keysym20 == 0x40000044) {
    local_c = SDLK12_F11;
  }
  else if (keysym20 == 0x40000045) {
    local_c = SDLK12_F12;
  }
  else if (keysym20 == 0x40000046) {
    local_c = SDLK12_PRINT;
  }
  else if (keysym20 == 0x40000047) {
    local_c = SDLK12_SCROLLOCK;
  }
  else if (keysym20 == 0x40000048) {
    local_c = SDLK12_PAUSE;
  }
  else if (keysym20 == 0x40000049) {
    local_c = SDLK12_INSERT;
  }
  else if (keysym20 == 0x4000004a) {
    local_c = SDLK12_HOME;
  }
  else if (keysym20 == 0x4000004b) {
    local_c = SDLK12_PAGEUP;
  }
  else if (keysym20 == 0x4000004d) {
    local_c = SDLK12_END;
  }
  else if (keysym20 == 0x4000004e) {
    local_c = SDLK12_PAGEDOWN;
  }
  else if (keysym20 == 0x4000004f) {
    local_c = SDLK12_RIGHT;
  }
  else if (keysym20 == 0x40000050) {
    local_c = SDLK12_LEFT;
  }
  else if (keysym20 == 0x40000051) {
    local_c = SDLK12_DOWN;
  }
  else if (keysym20 == 0x40000052) {
    local_c = SDLK12_UP;
  }
  else if (keysym20 == 0x40000053) {
    local_c = SDLK12_NUMLOCK;
  }
  else if (keysym20 == 0x40000054) {
    local_c = SDLK12_KP_DIVIDE;
  }
  else if (keysym20 == 0x40000055) {
    local_c = SDLK12_KP_MULTIPLY;
  }
  else if (keysym20 == 0x40000056) {
    local_c = SDLK12_KP_MINUS;
  }
  else if (keysym20 == 0x40000057) {
    local_c = SDLK12_KP_PLUS;
  }
  else if (keysym20 == 0x40000058) {
    local_c = SDLK12_KP_ENTER;
  }
  else if (keysym20 == 0x40000059) {
    local_c = SDLK12_KP1;
  }
  else if (keysym20 == 0x4000005a) {
    local_c = SDLK12_KP2;
  }
  else if (keysym20 == 0x4000005b) {
    local_c = SDLK12_KP3;
  }
  else if (keysym20 == 0x4000005c) {
    local_c = SDLK12_KP4;
  }
  else if (keysym20 == 0x4000005d) {
    local_c = SDLK12_KP5;
  }
  else if (keysym20 == 0x4000005e) {
    local_c = SDLK12_KP6;
  }
  else if (keysym20 == 0x4000005f) {
    local_c = SDLK12_KP7;
  }
  else if (keysym20 == 0x40000060) {
    local_c = SDLK12_KP8;
  }
  else if (keysym20 == 0x40000061) {
    local_c = SDLK12_KP9;
  }
  else if (keysym20 == 0x40000062) {
    local_c = SDLK12_KP0;
  }
  else if (keysym20 == 0x40000063) {
    local_c = SDLK12_KP_PERIOD;
  }
  else if (keysym20 == 0x40000066) {
    local_c = SDLK12_POWER;
  }
  else if (keysym20 == 0x40000067) {
    local_c = SDLK12_KP_EQUALS;
  }
  else if (keysym20 == 0x40000068) {
    local_c = SDLK12_F13;
  }
  else if (keysym20 == 0x40000069) {
    local_c = SDLK12_F14;
  }
  else if (keysym20 == 0x4000006a) {
    local_c = SDLK12_F15;
  }
  else if (keysym20 == 0x40000075) {
    local_c = SDLK12_HELP;
  }
  else if (keysym20 == 0x40000076) {
    local_c = SDLK12_MENU;
  }
  else if (keysym20 == 0x4000007a) {
    local_c = SDLK12_UNDO;
  }
  else if (keysym20 == 0x4000009a) {
    local_c = SDLK12_SYSREQ;
  }
  else if (keysym20 == 0x4000009c) {
    local_c = SDLK12_CLEAR;
  }
  else if (keysym20 == 0x400000e0) {
    local_c = SDLK12_LCTRL;
  }
  else if (keysym20 == 0x400000e1) {
    local_c = SDLK12_LSHIFT;
  }
  else if (keysym20 == 0x400000e2) {
    local_c = SDLK12_LALT;
  }
  else if (keysym20 == 0x400000e3) {
    local_c = SDLK12_LMETA;
  }
  else if (keysym20 == 0x400000e4) {
    local_c = SDLK12_RCTRL;
  }
  else if (keysym20 == 0x400000e5) {
    local_c = SDLK12_RSHIFT;
  }
  else if (keysym20 == 0x400000e6) {
    local_c = SDLK12_RALT;
  }
  else if (keysym20 == 0x400000e7) {
    local_c = SDLK12_RMETA;
  }
  else if (keysym20 == 0x40000101) {
    local_c = SDLK12_MODE;
  }
  else {
    local_c = SDLK12_FIRST;
  }
  return local_c;
}

Assistant:

static SDL12Key
Keysym20to12(const SDL_Keycode keysym20)
{
    if (((int) keysym20) <= 255) {
        /* (most of) low-ASCII maps directly,
         * and so does the Latin-1 range (128-255) */
        if (keysym20 == SDLK_PAUSE) {
            return SDLK12_PAUSE;
        }
        if (keysym20 == SDLK_CLEAR) {
            return SDLK12_CLEAR;
        }
        return (SDL12Key) keysym20;
    }

    switch (keysym20) {
    #define CASEKEYSYM20TO12(k20, k12) case SDLK_##k20: return SDLK12_##k12
    CASEKEYSYM20TO12(KP_0, KP0);
    CASEKEYSYM20TO12(KP_1, KP1);
    CASEKEYSYM20TO12(KP_2, KP2);
    CASEKEYSYM20TO12(KP_3, KP3);
    CASEKEYSYM20TO12(KP_4, KP4);
    CASEKEYSYM20TO12(KP_5, KP5);
    CASEKEYSYM20TO12(KP_6, KP6);
    CASEKEYSYM20TO12(KP_7, KP7);
    CASEKEYSYM20TO12(KP_8, KP8);
    CASEKEYSYM20TO12(KP_9, KP9);
    CASEKEYSYM20TO12(NUMLOCKCLEAR, NUMLOCK);
    CASEKEYSYM20TO12(SCROLLLOCK, SCROLLOCK);
    CASEKEYSYM20TO12(RGUI, RMETA);
    CASEKEYSYM20TO12(LGUI, LMETA);
    CASEKEYSYM20TO12(PRINTSCREEN, PRINT);
    #undef CASEKEYSYM20TO12

    #define CASEKEYSYM20TO12(k) case SDLK_##k: return SDLK12_##k
    CASEKEYSYM20TO12(CLEAR);
    CASEKEYSYM20TO12(PAUSE);
    CASEKEYSYM20TO12(KP_PERIOD);
    CASEKEYSYM20TO12(KP_DIVIDE);
    CASEKEYSYM20TO12(KP_MULTIPLY);
    CASEKEYSYM20TO12(KP_MINUS);
    CASEKEYSYM20TO12(KP_PLUS);
    CASEKEYSYM20TO12(KP_ENTER);
    CASEKEYSYM20TO12(KP_EQUALS);
    CASEKEYSYM20TO12(UP);
    CASEKEYSYM20TO12(DOWN);
    CASEKEYSYM20TO12(RIGHT);
    CASEKEYSYM20TO12(LEFT);
    CASEKEYSYM20TO12(INSERT);
    CASEKEYSYM20TO12(HOME);
    CASEKEYSYM20TO12(END);
    CASEKEYSYM20TO12(PAGEUP);
    CASEKEYSYM20TO12(PAGEDOWN);
    CASEKEYSYM20TO12(F1);
    CASEKEYSYM20TO12(F2);
    CASEKEYSYM20TO12(F3);
    CASEKEYSYM20TO12(F4);
    CASEKEYSYM20TO12(F5);
    CASEKEYSYM20TO12(F6);
    CASEKEYSYM20TO12(F7);
    CASEKEYSYM20TO12(F8);
    CASEKEYSYM20TO12(F9);
    CASEKEYSYM20TO12(F10);
    CASEKEYSYM20TO12(F11);
    CASEKEYSYM20TO12(F12);
    CASEKEYSYM20TO12(F13);
    CASEKEYSYM20TO12(F14);
    CASEKEYSYM20TO12(F15);
    CASEKEYSYM20TO12(CAPSLOCK);
    CASEKEYSYM20TO12(RSHIFT);
    CASEKEYSYM20TO12(LSHIFT);
    CASEKEYSYM20TO12(RCTRL);
    CASEKEYSYM20TO12(LCTRL);
    CASEKEYSYM20TO12(RALT);
    CASEKEYSYM20TO12(LALT);
    CASEKEYSYM20TO12(MODE);
    CASEKEYSYM20TO12(HELP);
    CASEKEYSYM20TO12(SYSREQ);
    CASEKEYSYM20TO12(MENU);
    CASEKEYSYM20TO12(POWER);
    CASEKEYSYM20TO12(UNDO);
    #undef CASEKEYSYM20TO12

    /* Map the "World Keys" (SDLK_WORLD_0 = 0xA0 to SDLK_WORLD_95 = 0xFF).
     * In SDL2 they're the UCS-4 (32bit unicode) code for the key,
     * in SDL1.2 (on X11 at least) they were the X11_KeySym & 0xFF,
     * if (X11_KeySym >> 8)) was either 0 to 8 or 0x0A or 0x0C or 0x0E
     * So map all those used UCS-4 codes to the corresponding SDLK12_WORLD_* codes
     * Note that the Latin-1 range (keysym20 <= 255) is already handled at the top of this function
     * Luckily X11's keysymdef.h lists both the values of the constants and their UCS4-value, like
     * #define XK_Aogonek                       0x01a1  / * U+0104 LATIN CAPITAL LETTER A WITH OGONEK * /
     * So I'm using that as a reference for our mappings, which only use
     * the lowest byte of the XK_* value, because of X11_KeySym & 0xFF in SDL1.2
     *
     * case UCS4_code: return (SDL12Key)lowest_byte_of_corresponding_X11_KeySym; */

    /* Latin-2 */
    case 0x0104: return (SDL12Key)0xa1;
    case 0x02D8: return (SDL12Key)0xa2;
    case 0x0141: return (SDL12Key)0xa3;
    case 0x013D: return (SDL12Key)0xa5;
    case 0x015A: return (SDL12Key)0xa6;
    case 0x0160: return (SDL12Key)0xa9;
    case 0x015E: return (SDL12Key)0xaa;
    case 0x0164: return (SDL12Key)0xab;
    case 0x0179: return (SDL12Key)0xac;
    case 0x017D: return (SDL12Key)0xae;
    case 0x017B: return (SDL12Key)0xaf;
    case 0x0105: return (SDL12Key)0xb1;
    case 0x02DB: return (SDL12Key)0xb2;
    case 0x0142: return (SDL12Key)0xb3;
    case 0x013E: return (SDL12Key)0xb5;
    case 0x015B: return (SDL12Key)0xb6;
    case 0x02C7: return (SDL12Key)0xb7;
    case 0x0161: return (SDL12Key)0xb9;
    case 0x015F: return (SDL12Key)0xba;
    case 0x0165: return (SDL12Key)0xbb;
    case 0x017A: return (SDL12Key)0xbc;
    case 0x02DD: return (SDL12Key)0xbd;
    case 0x017E: return (SDL12Key)0xbe;
    case 0x017C: return (SDL12Key)0xbf;
    case 0x0154: return (SDL12Key)0xc0;
    case 0x0102: return (SDL12Key)0xc3;
    case 0x0139: return (SDL12Key)0xc5;
    case 0x0106: return (SDL12Key)0xc6;
    case 0x010C: return (SDL12Key)0xc8;
    case 0x0118: return (SDL12Key)0xca;
    case 0x011A: return (SDL12Key)0xcc;
    case 0x010E: return (SDL12Key)0xcf;
    case 0x0110: return (SDL12Key)0xd0;
    case 0x0143: return (SDL12Key)0xd1;
    case 0x0147: return (SDL12Key)0xd2;
    case 0x0150: return (SDL12Key)0xd5;
    case 0x0158: return (SDL12Key)0xd8;
    case 0x016E: return (SDL12Key)0xd9;
    case 0x0170: return (SDL12Key)0xdb;
    case 0x0162: return (SDL12Key)0xde;
    case 0x0155: return (SDL12Key)0xe0;
    case 0x0103: return (SDL12Key)0xe3;
    case 0x013A: return (SDL12Key)0xe5;
    case 0x0107: return (SDL12Key)0xe6;
    case 0x010D: return (SDL12Key)0xe8;
    case 0x0119: return (SDL12Key)0xea;
    case 0x011B: return (SDL12Key)0xec;
    case 0x010F: return (SDL12Key)0xef;
    case 0x0111: return (SDL12Key)0xf0;
    case 0x0144: return (SDL12Key)0xf1;
    case 0x0148: return (SDL12Key)0xf2;
    case 0x0151: return (SDL12Key)0xf5;
    case 0x0159: return (SDL12Key)0xf8;
    case 0x016F: return (SDL12Key)0xf9;
    case 0x0171: return (SDL12Key)0xfb;
    case 0x0163: return (SDL12Key)0xfe;
    case 0x02D9: return (SDL12Key)0xff;
    /* Latin-3 */
    case 0x0126: return (SDL12Key)0xa1;
    case 0x0124: return (SDL12Key)0xa6;
    case 0x0130: return (SDL12Key)0xa9;
    case 0x011E: return (SDL12Key)0xab;
    case 0x0134: return (SDL12Key)0xac;
    case 0x0127: return (SDL12Key)0xb1;
    case 0x0125: return (SDL12Key)0xb6;
    case 0x0131: return (SDL12Key)0xb9;
    case 0x011F: return (SDL12Key)0xbb;
    case 0x0135: return (SDL12Key)0xbc;
    case 0x010A: return (SDL12Key)0xc5;
    case 0x0108: return (SDL12Key)0xc6;
    case 0x0120: return (SDL12Key)0xd5;
    case 0x011C: return (SDL12Key)0xd8;
    case 0x016C: return (SDL12Key)0xdd;
    case 0x015C: return (SDL12Key)0xde;
    case 0x010B: return (SDL12Key)0xe5;
    case 0x0109: return (SDL12Key)0xe6;
    case 0x0121: return (SDL12Key)0xf5;
    case 0x011D: return (SDL12Key)0xf8;
    case 0x016D: return (SDL12Key)0xfd;
    case 0x015D: return (SDL12Key)0xfe;
    /* Latin 4 */
    case 0x0138: return (SDL12Key)0xa2;
    case 0x0156: return (SDL12Key)0xa3;
    case 0x0128: return (SDL12Key)0xa5;
    case 0x013B: return (SDL12Key)0xa6;
    case 0x0112: return (SDL12Key)0xaa;
    case 0x0122: return (SDL12Key)0xab;
    case 0x0166: return (SDL12Key)0xac;
    case 0x0157: return (SDL12Key)0xb3;
    case 0x0129: return (SDL12Key)0xb5;
    case 0x013C: return (SDL12Key)0xb6;
    case 0x0113: return (SDL12Key)0xba;
    case 0x0123: return (SDL12Key)0xbb;
    case 0x0167: return (SDL12Key)0xbc;
    case 0x014A: return (SDL12Key)0xbd;
    case 0x014B: return (SDL12Key)0xbf;
    case 0x0100: return (SDL12Key)0xc0;
    case 0x012E: return (SDL12Key)0xc7;
    case 0x0116: return (SDL12Key)0xcc;
    case 0x012A: return (SDL12Key)0xcf;
    case 0x0145: return (SDL12Key)0xd1;
    case 0x014C: return (SDL12Key)0xd2;
    case 0x0136: return (SDL12Key)0xd3;
    case 0x0172: return (SDL12Key)0xd9;
    case 0x0168: return (SDL12Key)0xdd;
    case 0x016A: return (SDL12Key)0xde;
    case 0x0101: return (SDL12Key)0xe0;
    case 0x012F: return (SDL12Key)0xe7;
    case 0x0117: return (SDL12Key)0xec;
    case 0x012B: return (SDL12Key)0xef;
    case 0x0146: return (SDL12Key)0xf1;
    case 0x014D: return (SDL12Key)0xf2;
    case 0x0137: return (SDL12Key)0xf3;
    case 0x0173: return (SDL12Key)0xf9;
    case 0x0169: return (SDL12Key)0xfd;
    case 0x016B: return (SDL12Key)0xfe;
    /* Katakana */
    case 0x203E: return (SDL12Key)0x7e;
    case 0x3002: return (SDL12Key)0xa1;
    case 0x300C: return (SDL12Key)0xa2;
    case 0x300D: return (SDL12Key)0xa3;
    case 0x3001: return (SDL12Key)0xa4;
    case 0x30FB: return (SDL12Key)0xa5;
    case 0x30F2: return (SDL12Key)0xa6;
    case 0x30A1: return (SDL12Key)0xa7;
    case 0x30A3: return (SDL12Key)0xa8;
    case 0x30A5: return (SDL12Key)0xa9;
    case 0x30A7: return (SDL12Key)0xaa;
    case 0x30A9: return (SDL12Key)0xab;
    case 0x30E3: return (SDL12Key)0xac;
    case 0x30E5: return (SDL12Key)0xad;
    case 0x30E7: return (SDL12Key)0xae;
    case 0x30C3: return (SDL12Key)0xaf;
    case 0x30FC: return (SDL12Key)0xb0;
    case 0x30A2: return (SDL12Key)0xb1;
    case 0x30A4: return (SDL12Key)0xb2;
    case 0x30A6: return (SDL12Key)0xb3;
    case 0x30A8: return (SDL12Key)0xb4;
    case 0x30AA: return (SDL12Key)0xb5;
    case 0x30AB: return (SDL12Key)0xb6;
    case 0x30AD: return (SDL12Key)0xb7;
    case 0x30AF: return (SDL12Key)0xb8;
    case 0x30B1: return (SDL12Key)0xb9;
    case 0x30B3: return (SDL12Key)0xba;
    case 0x30B5: return (SDL12Key)0xbb;
    case 0x30B7: return (SDL12Key)0xbc;
    case 0x30B9: return (SDL12Key)0xbd;
    case 0x30BB: return (SDL12Key)0xbe;
    case 0x30BD: return (SDL12Key)0xbf;
    case 0x30BF: return (SDL12Key)0xc0;
    case 0x30C1: return (SDL12Key)0xc1;
    case 0x30C4: return (SDL12Key)0xc2;
    case 0x30C6: return (SDL12Key)0xc3;
    case 0x30C8: return (SDL12Key)0xc4;
    case 0x30CA: return (SDL12Key)0xc5;
    case 0x30CB: return (SDL12Key)0xc6;
    case 0x30CC: return (SDL12Key)0xc7;
    case 0x30CD: return (SDL12Key)0xc8;
    case 0x30CE: return (SDL12Key)0xc9;
    case 0x30CF: return (SDL12Key)0xca;
    case 0x30D2: return (SDL12Key)0xcb;
    case 0x30D5: return (SDL12Key)0xcc;
    case 0x30D8: return (SDL12Key)0xcd;
    case 0x30DB: return (SDL12Key)0xce;
    case 0x30DE: return (SDL12Key)0xcf;
    case 0x30DF: return (SDL12Key)0xd0;
    case 0x30E0: return (SDL12Key)0xd1;
    case 0x30E1: return (SDL12Key)0xd2;
    case 0x30E2: return (SDL12Key)0xd3;
    case 0x30E4: return (SDL12Key)0xd4;
    case 0x30E6: return (SDL12Key)0xd5;
    case 0x30E8: return (SDL12Key)0xd6;
    case 0x30E9: return (SDL12Key)0xd7;
    case 0x30EA: return (SDL12Key)0xd8;
    case 0x30EB: return (SDL12Key)0xd9;
    case 0x30EC: return (SDL12Key)0xda;
    case 0x30ED: return (SDL12Key)0xdb;
    case 0x30EF: return (SDL12Key)0xdc;
    case 0x30F3: return (SDL12Key)0xdd;
    case 0x309B: return (SDL12Key)0xde;
    case 0x309C: return (SDL12Key)0xdf;
    /* Arabic */
    case 0x060C: return (SDL12Key)0xac;
    case 0x061B: return (SDL12Key)0xbb;
    case 0x061F: return (SDL12Key)0xbf;
    case 0x0621: return (SDL12Key)0xc1;
    case 0x0622: return (SDL12Key)0xc2;
    case 0x0623: return (SDL12Key)0xc3;
    case 0x0624: return (SDL12Key)0xc4;
    case 0x0625: return (SDL12Key)0xc5;
    case 0x0626: return (SDL12Key)0xc6;
    case 0x0627: return (SDL12Key)0xc7;
    case 0x0628: return (SDL12Key)0xc8;
    case 0x0629: return (SDL12Key)0xc9;
    case 0x062A: return (SDL12Key)0xca;
    case 0x062B: return (SDL12Key)0xcb;
    case 0x062C: return (SDL12Key)0xcc;
    case 0x062D: return (SDL12Key)0xcd;
    case 0x062E: return (SDL12Key)0xce;
    case 0x062F: return (SDL12Key)0xcf;
    case 0x0630: return (SDL12Key)0xd0;
    case 0x0631: return (SDL12Key)0xd1;
    case 0x0632: return (SDL12Key)0xd2;
    case 0x0633: return (SDL12Key)0xd3;
    case 0x0634: return (SDL12Key)0xd4;
    case 0x0635: return (SDL12Key)0xd5;
    case 0x0636: return (SDL12Key)0xd6;
    case 0x0637: return (SDL12Key)0xd7;
    case 0x0638: return (SDL12Key)0xd8;
    case 0x0639: return (SDL12Key)0xd9;
    case 0x063A: return (SDL12Key)0xda;
    case 0x0640: return (SDL12Key)0xe0;
    case 0x0641: return (SDL12Key)0xe1;
    case 0x0642: return (SDL12Key)0xe2;
    case 0x0643: return (SDL12Key)0xe3;
    case 0x0644: return (SDL12Key)0xe4;
    case 0x0645: return (SDL12Key)0xe5;
    case 0x0646: return (SDL12Key)0xe6;
    case 0x0647: return (SDL12Key)0xe7;
    case 0x0648: return (SDL12Key)0xe8;
    case 0x0649: return (SDL12Key)0xe9;
    case 0x064A: return (SDL12Key)0xea;
    case 0x064B: return (SDL12Key)0xeb;
    case 0x064C: return (SDL12Key)0xec;
    case 0x064D: return (SDL12Key)0xed;
    case 0x064E: return (SDL12Key)0xee;
    case 0x064F: return (SDL12Key)0xef;
    case 0x0650: return (SDL12Key)0xf0;
    case 0x0651: return (SDL12Key)0xf1;
    case 0x0652: return (SDL12Key)0xf2;
    /* Cyrillic */
    case 0x0452: return (SDL12Key)0xa1;
    case 0x0453: return (SDL12Key)0xa2;
    case 0x0451: return (SDL12Key)0xa3;
    case 0x0454: return (SDL12Key)0xa4;
    case 0x0455: return (SDL12Key)0xa5;
    case 0x0456: return (SDL12Key)0xa6;
    case 0x0457: return (SDL12Key)0xa7;
    case 0x0458: return (SDL12Key)0xa8;
    case 0x0459: return (SDL12Key)0xa9;
    case 0x045A: return (SDL12Key)0xaa;
    case 0x045B: return (SDL12Key)0xab;
    case 0x045C: return (SDL12Key)0xac;
    case 0x0491: return (SDL12Key)0xad;
    case 0x045E: return (SDL12Key)0xae;
    case 0x045F: return (SDL12Key)0xaf;
    case 0x2116: return (SDL12Key)0xb0;
    case 0x0402: return (SDL12Key)0xb1;
    case 0x0403: return (SDL12Key)0xb2;
    case 0x0401: return (SDL12Key)0xb3;
    case 0x0404: return (SDL12Key)0xb4;
    case 0x0405: return (SDL12Key)0xb5;
    case 0x0406: return (SDL12Key)0xb6;
    case 0x0407: return (SDL12Key)0xb7;
    case 0x0408: return (SDL12Key)0xb8;
    case 0x0409: return (SDL12Key)0xb9;
    case 0x040A: return (SDL12Key)0xba;
    case 0x040B: return (SDL12Key)0xbb;
    case 0x040C: return (SDL12Key)0xbc;
    case 0x0490: return (SDL12Key)0xbd;
    case 0x040E: return (SDL12Key)0xbe;
    case 0x040F: return (SDL12Key)0xbf;
    case 0x044E: return (SDL12Key)0xc0;
    case 0x0430: return (SDL12Key)0xc1;
    case 0x0431: return (SDL12Key)0xc2;
    case 0x0446: return (SDL12Key)0xc3;
    case 0x0434: return (SDL12Key)0xc4;
    case 0x0435: return (SDL12Key)0xc5;
    case 0x0444: return (SDL12Key)0xc6;
    case 0x0433: return (SDL12Key)0xc7;
    case 0x0445: return (SDL12Key)0xc8;
    case 0x0438: return (SDL12Key)0xc9;
    case 0x0439: return (SDL12Key)0xca;
    case 0x043A: return (SDL12Key)0xcb;
    case 0x043B: return (SDL12Key)0xcc;
    case 0x043C: return (SDL12Key)0xcd;
    case 0x043D: return (SDL12Key)0xce;
    case 0x043E: return (SDL12Key)0xcf;
    case 0x043F: return (SDL12Key)0xd0;
    case 0x044F: return (SDL12Key)0xd1;
    case 0x0440: return (SDL12Key)0xd2;
    case 0x0441: return (SDL12Key)0xd3;
    case 0x0442: return (SDL12Key)0xd4;
    case 0x0443: return (SDL12Key)0xd5;
    case 0x0436: return (SDL12Key)0xd6;
    case 0x0432: return (SDL12Key)0xd7;
    case 0x044C: return (SDL12Key)0xd8;
    case 0x044B: return (SDL12Key)0xd9;
    case 0x0437: return (SDL12Key)0xda;
    case 0x0448: return (SDL12Key)0xdb;
    case 0x044D: return (SDL12Key)0xdc;
    case 0x0449: return (SDL12Key)0xdd;
    case 0x0447: return (SDL12Key)0xde;
    case 0x044A: return (SDL12Key)0xdf;
    case 0x042E: return (SDL12Key)0xe0;
    case 0x0410: return (SDL12Key)0xe1;
    case 0x0411: return (SDL12Key)0xe2;
    case 0x0426: return (SDL12Key)0xe3;
    case 0x0414: return (SDL12Key)0xe4;
    case 0x0415: return (SDL12Key)0xe5;
    case 0x0424: return (SDL12Key)0xe6;
    case 0x0413: return (SDL12Key)0xe7;
    case 0x0425: return (SDL12Key)0xe8;
    case 0x0418: return (SDL12Key)0xe9;
    case 0x0419: return (SDL12Key)0xea;
    case 0x041A: return (SDL12Key)0xeb;
    case 0x041B: return (SDL12Key)0xec;
    case 0x041C: return (SDL12Key)0xed;
    case 0x041D: return (SDL12Key)0xee;
    case 0x041E: return (SDL12Key)0xef;
    case 0x041F: return (SDL12Key)0xf0;
    case 0x042F: return (SDL12Key)0xf1;
    case 0x0420: return (SDL12Key)0xf2;
    case 0x0421: return (SDL12Key)0xf3;
    case 0x0422: return (SDL12Key)0xf4;
    case 0x0423: return (SDL12Key)0xf5;
    case 0x0416: return (SDL12Key)0xf6;
    case 0x0412: return (SDL12Key)0xf7;
    case 0x042C: return (SDL12Key)0xf8;
    case 0x042B: return (SDL12Key)0xf9;
    case 0x0417: return (SDL12Key)0xfa;
    case 0x0428: return (SDL12Key)0xfb;
    case 0x042D: return (SDL12Key)0xfc;
    case 0x0429: return (SDL12Key)0xfd;
    case 0x0427: return (SDL12Key)0xfe;
    case 0x042A: return (SDL12Key)0xff;
    /* Greek */
    case 0x0386: return (SDL12Key)0xa1;
    case 0x0388: return (SDL12Key)0xa2;
    case 0x0389: return (SDL12Key)0xa3;
    case 0x038A: return (SDL12Key)0xa4;
    case 0x03AA: return (SDL12Key)0xa5;
    case 0x038C: return (SDL12Key)0xa7;
    case 0x038E: return (SDL12Key)0xa8;
    case 0x03AB: return (SDL12Key)0xa9;
    case 0x038F: return (SDL12Key)0xab;
    case 0x0385: return (SDL12Key)0xae;
    case 0x2015: return (SDL12Key)0xaf;
    case 0x03AC: return (SDL12Key)0xb1;
    case 0x03AD: return (SDL12Key)0xb2;
    case 0x03AE: return (SDL12Key)0xb3;
    case 0x03AF: return (SDL12Key)0xb4;
    case 0x03CA: return (SDL12Key)0xb5;
    case 0x0390: return (SDL12Key)0xb6;
    case 0x03CC: return (SDL12Key)0xb7;
    case 0x03CD: return (SDL12Key)0xb8;
    case 0x03CB: return (SDL12Key)0xb9;
    case 0x03B0: return (SDL12Key)0xba;
    case 0x03CE: return (SDL12Key)0xbb;
    case 0x0391: return (SDL12Key)0xc1;
    case 0x0392: return (SDL12Key)0xc2;
    case 0x0393: return (SDL12Key)0xc3;
    case 0x0394: return (SDL12Key)0xc4;
    case 0x0395: return (SDL12Key)0xc5;
    case 0x0396: return (SDL12Key)0xc6;
    case 0x0397: return (SDL12Key)0xc7;
    case 0x0398: return (SDL12Key)0xc8;
    case 0x0399: return (SDL12Key)0xc9;
    case 0x039A: return (SDL12Key)0xca;
    case 0x039B: return (SDL12Key)0xcb;
    case 0x039C: return (SDL12Key)0xcc;
    case 0x039D: return (SDL12Key)0xcd;
    case 0x039E: return (SDL12Key)0xce;
    case 0x039F: return (SDL12Key)0xcf;
    case 0x03A0: return (SDL12Key)0xd0;
    case 0x03A1: return (SDL12Key)0xd1;
    case 0x03A3: return (SDL12Key)0xd2;
    case 0x03A4: return (SDL12Key)0xd4;
    case 0x03A5: return (SDL12Key)0xd5;
    case 0x03A6: return (SDL12Key)0xd6;
    case 0x03A7: return (SDL12Key)0xd7;
    case 0x03A8: return (SDL12Key)0xd8;
    case 0x03A9: return (SDL12Key)0xd9;
    case 0x03B1: return (SDL12Key)0xe1;
    case 0x03B2: return (SDL12Key)0xe2;
    case 0x03B3: return (SDL12Key)0xe3;
    case 0x03B4: return (SDL12Key)0xe4;
    case 0x03B5: return (SDL12Key)0xe5;
    case 0x03B6: return (SDL12Key)0xe6;
    case 0x03B7: return (SDL12Key)0xe7;
    case 0x03B8: return (SDL12Key)0xe8;
    case 0x03B9: return (SDL12Key)0xe9;
    case 0x03BA: return (SDL12Key)0xea;
    case 0x03BB: return (SDL12Key)0xeb;
    case 0x03BC: return (SDL12Key)0xec;
    case 0x03BD: return (SDL12Key)0xed;
    case 0x03BE: return (SDL12Key)0xee;
    case 0x03BF: return (SDL12Key)0xef;
    case 0x03C0: return (SDL12Key)0xf0;
    case 0x03C1: return (SDL12Key)0xf1;
    case 0x03C3: return (SDL12Key)0xf2;
    case 0x03C2: return (SDL12Key)0xf3;
    case 0x03C4: return (SDL12Key)0xf4;
    case 0x03C5: return (SDL12Key)0xf5;
    case 0x03C6: return (SDL12Key)0xf6;
    case 0x03C7: return (SDL12Key)0xf7;
    case 0x03C8: return (SDL12Key)0xf8;
    case 0x03C9: return (SDL12Key)0xf9;
    /* Technical */
    case 0x23B7: return (SDL12Key)0xa1;
    case 0x250C: return (SDL12Key)0xa2;
    case 0x2500: return (SDL12Key)0xa3;
    case 0x2320: return (SDL12Key)0xa4;
    case 0x2321: return (SDL12Key)0xa5;
    case 0x2502: return (SDL12Key)0xa6;
    case 0x23A1: return (SDL12Key)0xa7;
    case 0x23A3: return (SDL12Key)0xa8;
    case 0x23A4: return (SDL12Key)0xa9;
    case 0x23A6: return (SDL12Key)0xaa;
    case 0x239B: return (SDL12Key)0xab;
    case 0x239D: return (SDL12Key)0xac;
    case 0x239E: return (SDL12Key)0xad;
    case 0x23A0: return (SDL12Key)0xae;
    case 0x23A8: return (SDL12Key)0xaf;
    case 0x23AC: return (SDL12Key)0xb0;
    case 0x2264: return (SDL12Key)0xbc;
    case 0x2260: return (SDL12Key)0xbd;
    case 0x2265: return (SDL12Key)0xbe;
    case 0x222B: return (SDL12Key)0xbf;
    case 0x2234: return (SDL12Key)0xc0;
    case 0x221D: return (SDL12Key)0xc1;
    case 0x221E: return (SDL12Key)0xc2;
    case 0x2207: return (SDL12Key)0xc5;
    case 0x223C: return (SDL12Key)0xc8;
    case 0x2243: return (SDL12Key)0xc9;
    case 0x21D4: return (SDL12Key)0xcd;
    case 0x21D2: return (SDL12Key)0xce;
    case 0x2261: return (SDL12Key)0xcf;
    case 0x221A: return (SDL12Key)0xd6;
    case 0x2282: return (SDL12Key)0xda;
    case 0x2283: return (SDL12Key)0xdb;
    case 0x2229: return (SDL12Key)0xdc;
    case 0x222A: return (SDL12Key)0xdd;
    case 0x2227: return (SDL12Key)0xde;
    case 0x2228: return (SDL12Key)0xdf;
    case 0x2202: return (SDL12Key)0xef;
    case 0x0192: return (SDL12Key)0xf6;
    case 0x2190: return (SDL12Key)0xfb;
    case 0x2191: return (SDL12Key)0xfc;
    case 0x2192: return (SDL12Key)0xfd;
    case 0x2193: return (SDL12Key)0xfe;
    /* Publishing */
    case 0x2003: return (SDL12Key)0xa1;
    case 0x2002: return (SDL12Key)0xa2;
    case 0x2004: return (SDL12Key)0xa3;
    case 0x2005: return (SDL12Key)0xa4;
    case 0x2007: return (SDL12Key)0xa5;
    case 0x2008: return (SDL12Key)0xa6;
    case 0x2009: return (SDL12Key)0xa7;
    case 0x200A: return (SDL12Key)0xa8;
    case 0x2014: return (SDL12Key)0xa9;
    case 0x2013: return (SDL12Key)0xaa;
    case 0x2423: return (SDL12Key)0xac;
    case 0x2026: return (SDL12Key)0xae;
    case 0x2025: return (SDL12Key)0xaf;
    case 0x2153: return (SDL12Key)0xb0;
    case 0x2154: return (SDL12Key)0xb1;
    case 0x2155: return (SDL12Key)0xb2;
    case 0x2156: return (SDL12Key)0xb3;
    case 0x2157: return (SDL12Key)0xb4;
    case 0x2158: return (SDL12Key)0xb5;
    case 0x2159: return (SDL12Key)0xb6;
    case 0x215A: return (SDL12Key)0xb7;
    case 0x2105: return (SDL12Key)0xb8;
    case 0x2012: return (SDL12Key)0xbb;
    case 0x27E8: return (SDL12Key)0xbc;
    case 0x002E: return (SDL12Key)0xbd;
    case 0x27E9: return (SDL12Key)0xbe;
    case 0x215B: return (SDL12Key)0xc3;
    case 0x215C: return (SDL12Key)0xc4;
    case 0x215D: return (SDL12Key)0xc5;
    case 0x215E: return (SDL12Key)0xc6;
    case 0x2122: return (SDL12Key)0xc9;
    case 0x2613: return (SDL12Key)0xca;
    case 0x25C1: return (SDL12Key)0xcc;
    case 0x25B7: return (SDL12Key)0xcd;
    case 0x25CB: return (SDL12Key)0xce;
    case 0x25AF: return (SDL12Key)0xcf;
    case 0x2018: return (SDL12Key)0xd0;
    case 0x2019: return (SDL12Key)0xd1;
    case 0x201C: return (SDL12Key)0xd2;
    case 0x201D: return (SDL12Key)0xd3;
    case 0x211E: return (SDL12Key)0xd4;
    case 0x2030: return (SDL12Key)0xd5;
    case 0x2032: return (SDL12Key)0xd6;
    case 0x2033: return (SDL12Key)0xd7;
    case 0x271D: return (SDL12Key)0xd9;
    case 0x25AC: return (SDL12Key)0xdb;
    case 0x25C0: return (SDL12Key)0xdc;
    case 0x25B6: return (SDL12Key)0xdd;
    case 0x25CF: return (SDL12Key)0xde;
    case 0x25AE: return (SDL12Key)0xdf;
    case 0x25E6: return (SDL12Key)0xe0;
    case 0x25AB: return (SDL12Key)0xe1;
    case 0x25AD: return (SDL12Key)0xe2;
    case 0x25B3: return (SDL12Key)0xe3;
    case 0x25BD: return (SDL12Key)0xe4;
    case 0x2606: return (SDL12Key)0xe5;
    case 0x2022: return (SDL12Key)0xe6;
    case 0x25AA: return (SDL12Key)0xe7;
    case 0x25B2: return (SDL12Key)0xe8;
    case 0x25BC: return (SDL12Key)0xe9;
    case 0x261C: return (SDL12Key)0xea;
    case 0x261E: return (SDL12Key)0xeb;
    case 0x2663: return (SDL12Key)0xec;
    case 0x2666: return (SDL12Key)0xed;
    case 0x2665: return (SDL12Key)0xee;
    case 0x2720: return (SDL12Key)0xf0;
    case 0x2020: return (SDL12Key)0xf1;
    case 0x2021: return (SDL12Key)0xf2;
    case 0x2713: return (SDL12Key)0xf3;
    case 0x2717: return (SDL12Key)0xf4;
    case 0x266F: return (SDL12Key)0xf5;
    case 0x266D: return (SDL12Key)0xf6;
    case 0x2642: return (SDL12Key)0xf7;
    case 0x2640: return (SDL12Key)0xf8;
    case 0x260E: return (SDL12Key)0xf9;
    case 0x2315: return (SDL12Key)0xfa;
    case 0x2117: return (SDL12Key)0xfb;
    case 0x2038: return (SDL12Key)0xfc;
    case 0x201A: return (SDL12Key)0xfd;
    case 0x201E: return (SDL12Key)0xfe;
    /* Hebrew */
    case 0x2017: return (SDL12Key)0xdf;
    case 0x05D0: return (SDL12Key)0xe0;
    case 0x05D1: return (SDL12Key)0xe1;
    case 0x05D2: return (SDL12Key)0xe2;
    case 0x05D3: return (SDL12Key)0xe3;
    case 0x05D4: return (SDL12Key)0xe4;
    case 0x05D5: return (SDL12Key)0xe5;
    case 0x05D6: return (SDL12Key)0xe6;
    case 0x05D7: return (SDL12Key)0xe7;
    case 0x05D8: return (SDL12Key)0xe8;
    case 0x05D9: return (SDL12Key)0xe9;
    case 0x05DA: return (SDL12Key)0xea;
    case 0x05DB: return (SDL12Key)0xeb;
    case 0x05DC: return (SDL12Key)0xec;
    case 0x05DD: return (SDL12Key)0xed;
    case 0x05DE: return (SDL12Key)0xee;
    case 0x05DF: return (SDL12Key)0xef;
    case 0x05E0: return (SDL12Key)0xf0;
    case 0x05E1: return (SDL12Key)0xf1;
    case 0x05E2: return (SDL12Key)0xf2;
    case 0x05E3: return (SDL12Key)0xf3;
    case 0x05E4: return (SDL12Key)0xf4;
    case 0x05E5: return (SDL12Key)0xf5;
    case 0x05E6: return (SDL12Key)0xf6;
    case 0x05E7: return (SDL12Key)0xf7;
    case 0x05E8: return (SDL12Key)0xf8;
    case 0x05E9: return (SDL12Key)0xf9;
    case 0x05EA: return (SDL12Key)0xfa;
    /* Thai */
    case 0x0E01: return (SDL12Key)0xa1;
    case 0x0E02: return (SDL12Key)0xa2;
    case 0x0E03: return (SDL12Key)0xa3;
    case 0x0E04: return (SDL12Key)0xa4;
    case 0x0E05: return (SDL12Key)0xa5;
    case 0x0E06: return (SDL12Key)0xa6;
    case 0x0E07: return (SDL12Key)0xa7;
    case 0x0E08: return (SDL12Key)0xa8;
    case 0x0E09: return (SDL12Key)0xa9;
    case 0x0E0A: return (SDL12Key)0xaa;
    case 0x0E0B: return (SDL12Key)0xab;
    case 0x0E0C: return (SDL12Key)0xac;
    case 0x0E0D: return (SDL12Key)0xad;
    case 0x0E0E: return (SDL12Key)0xae;
    case 0x0E0F: return (SDL12Key)0xaf;
    case 0x0E10: return (SDL12Key)0xb0;
    case 0x0E11: return (SDL12Key)0xb1;
    case 0x0E12: return (SDL12Key)0xb2;
    case 0x0E13: return (SDL12Key)0xb3;
    case 0x0E14: return (SDL12Key)0xb4;
    case 0x0E15: return (SDL12Key)0xb5;
    case 0x0E16: return (SDL12Key)0xb6;
    case 0x0E17: return (SDL12Key)0xb7;
    case 0x0E18: return (SDL12Key)0xb8;
    case 0x0E19: return (SDL12Key)0xb9;
    case 0x0E1A: return (SDL12Key)0xba;
    case 0x0E1B: return (SDL12Key)0xbb;
    case 0x0E1C: return (SDL12Key)0xbc;
    case 0x0E1D: return (SDL12Key)0xbd;
    case 0x0E1E: return (SDL12Key)0xbe;
    case 0x0E1F: return (SDL12Key)0xbf;
    case 0x0E20: return (SDL12Key)0xc0;
    case 0x0E21: return (SDL12Key)0xc1;
    case 0x0E22: return (SDL12Key)0xc2;
    case 0x0E23: return (SDL12Key)0xc3;
    case 0x0E24: return (SDL12Key)0xc4;
    case 0x0E25: return (SDL12Key)0xc5;
    case 0x0E26: return (SDL12Key)0xc6;
    case 0x0E27: return (SDL12Key)0xc7;
    case 0x0E28: return (SDL12Key)0xc8;
    case 0x0E29: return (SDL12Key)0xc9;
    case 0x0E2A: return (SDL12Key)0xca;
    case 0x0E2B: return (SDL12Key)0xcb;
    case 0x0E2C: return (SDL12Key)0xcc;
    case 0x0E2D: return (SDL12Key)0xcd;
    case 0x0E2E: return (SDL12Key)0xce;
    case 0x0E2F: return (SDL12Key)0xcf;
    case 0x0E30: return (SDL12Key)0xd0;
    case 0x0E31: return (SDL12Key)0xd1;
    case 0x0E32: return (SDL12Key)0xd2;
    case 0x0E33: return (SDL12Key)0xd3;
    case 0x0E34: return (SDL12Key)0xd4;
    case 0x0E35: return (SDL12Key)0xd5;
    case 0x0E36: return (SDL12Key)0xd6;
    case 0x0E37: return (SDL12Key)0xd7;
    case 0x0E38: return (SDL12Key)0xd8;
    case 0x0E39: return (SDL12Key)0xd9;
    case 0x0E3A: return (SDL12Key)0xda;
    case 0x0E3F: return (SDL12Key)0xdf;
    case 0x0E40: return (SDL12Key)0xe0;
    case 0x0E41: return (SDL12Key)0xe1;
    case 0x0E42: return (SDL12Key)0xe2;
    case 0x0E43: return (SDL12Key)0xe3;
    case 0x0E44: return (SDL12Key)0xe4;
    case 0x0E45: return (SDL12Key)0xe5;
    case 0x0E46: return (SDL12Key)0xe6;
    case 0x0E47: return (SDL12Key)0xe7;
    case 0x0E48: return (SDL12Key)0xe8;
    case 0x0E49: return (SDL12Key)0xe9;
    case 0x0E4A: return (SDL12Key)0xea;
    case 0x0E4B: return (SDL12Key)0xeb;
    case 0x0E4C: return (SDL12Key)0xec;
    case 0x0E4D: return (SDL12Key)0xed;
    case 0x0E50: return (SDL12Key)0xf0;
    case 0x0E51: return (SDL12Key)0xf1;
    case 0x0E52: return (SDL12Key)0xf2;
    case 0x0E53: return (SDL12Key)0xf3;
    case 0x0E54: return (SDL12Key)0xf4;
    case 0x0E55: return (SDL12Key)0xf5;
    case 0x0E56: return (SDL12Key)0xf6;
    case 0x0E57: return (SDL12Key)0xf7;
    case 0x0E58: return (SDL12Key)0xf8;
    case 0x0E59: return (SDL12Key)0xf9;
    /* end of SDLK_WORLD_ keys based on Latin-* or similar High-ASCII charsets
     * and the low byte of their corresponding X11 XK_* KeySyms */
    default: break;
    }

    return SDLK12_UNKNOWN;
}